

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Helpers.cpp
# Opt level: O1

void Helpers::TTReportLastIOErrorAsNeeded(BOOL ok,char *msg)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  char16_t *in_RCX;
  long lVar6;
  char *__s;
  char *__path;
  ulong *puVar7;
  char16_t *format;
  undefined1 auStack_80 [64];
  char *pcStack_40;
  
  if (ok != 0) {
    return;
  }
  puVar7 = (ulong *)msg;
  TTReportLastIOErrorAsNeeded((Helpers *)msg);
  uVar1 = *puVar7;
  pcStack_40 = msg;
  sVar3 = strlen(__s);
  sVar4 = PAL_wcslen(in_RCX);
  if (0xfffffffffffffdfe < (sVar4 + sVar3 + uVar1) - 0x1ff) {
    sVar3 = strlen(__s);
    if (sVar3 < 0x40) {
      sVar4 = PAL_wcslen(in_RCX);
      __path = pcStack_40;
      if (sVar4 < 0x40) {
        iVar2 = sprintf_s(pcStack_40 + *puVar7,0x40,"%s%s",__s,"/");
        if ((iVar2 == -1) || (0x200 < (long)iVar2 + *puVar7)) {
          format = L"Failed directory extension 1.\n";
        }
        else {
          *puVar7 = (long)iVar2 + *puVar7;
          iVar2 = mkdir(__path,0x1c0);
          if (iVar2 != 0) {
            piVar5 = PAL_errno(0);
            TTReportLastIOErrorAsNeeded((uint)(*piVar5 == 0x11),"Failed to create directory");
          }
          sVar4 = PAL_wcslen(in_RCX);
          if (sVar4 != 0xffffffffffffffff) {
            lVar6 = 0;
            do {
              if (0x7f < (ushort)in_RCX[lVar6]) {
                PAL_wprintf(L"Test directory names can only include ascii chars.\n");
                goto LAB_0010dae4;
              }
              auStack_80[lVar6] = (char)in_RCX[lVar6];
              lVar6 = lVar6 + 1;
            } while (sVar4 + 1 != lVar6);
          }
          iVar2 = sprintf_s(__path + *puVar7,0x40,"%s%s",auStack_80,"/");
          if ((iVar2 != -1) && ((long)iVar2 + *puVar7 < 0x201)) {
            *puVar7 = (long)iVar2 + *puVar7;
            iVar2 = mkdir(__path,0x1c0);
            if (iVar2 != 0) {
              piVar5 = PAL_errno(0);
              TTReportLastIOErrorAsNeeded((uint)(*piVar5 == 0x11),"Failed to create directory");
            }
            return;
          }
          format = L"Failed directory create 2.\n";
        }
        PAL_wprintf(format);
        goto LAB_0010dad7;
      }
    }
  }
  PAL_wprintf(L"We assume bounded MAX_URI_LENGTH for simplicity.\n");
  __path = pcStack_40;
LAB_0010dad7:
  PAL_wprintf(L"%S, %S, %ls\n",__path,__s,in_RCX);
LAB_0010dae4:
  PAL_exit(1);
}

Assistant:

void Helpers::TTReportLastIOErrorAsNeeded(BOOL ok, const char* msg)
{
    if(!ok)
    {
#ifdef _WIN32
        DWORD lastError = GetLastError();
        LPTSTR pTemp = NULL;
        FormatMessage(FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM | FORMAT_MESSAGE_IGNORE_INSERTS, NULL, lastError, 0, (LPTSTR)&pTemp, 0, NULL);
        fwprintf(stderr, _u("Error is: %s\n"), pTemp);
        LocalFree(pTemp);
#else
        fprintf(stderr, "Error is: %i %s\n", errno, strerror(errno));
#endif
        fprintf(stderr, "Message is: %s\n", msg);

        AssertMsg(false, "IO Error!!!");
        exit(1);
    }
}